

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

ALLEGRO_FILE_INTERFACE * al_get_new_file_interface(void)

{
  thread_local_state *ptVar1;
  ALLEGRO_FILE_INTERFACE *pAVar2;
  
  ptVar1 = tls_get();
  if ((ptVar1 == (thread_local_state *)0x0) ||
     (pAVar2 = ptVar1->new_file_interface, pAVar2 == (ALLEGRO_FILE_INTERFACE *)0x0)) {
    pAVar2 = &_al_file_interface_stdio;
  }
  return pAVar2;
}

Assistant:

const ALLEGRO_FILE_INTERFACE *al_get_new_file_interface(void)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return &_al_file_interface_stdio;

   /* FIXME: this situation should never arise because tls_ has the stdio
    * interface set as a default, but it arises on OS X if
    * pthread_getspecific() is called before pthreads_thread_init()...
    */
   if (tls->new_file_interface)
      return tls->new_file_interface;
   else
      return &_al_file_interface_stdio;
}